

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_vfs_close(ma_vfs *pVFS,ma_vfs_file file)

{
  long in_RSI;
  long in_RDI;
  ma_vfs_callbacks *pCallbacks;
  undefined4 local_4;
  
  if ((in_RDI == 0) || (in_RSI == 0)) {
    local_4 = MA_INVALID_ARGS;
  }
  else if (*(long *)(in_RDI + 0x10) == 0) {
    local_4 = MA_NOT_IMPLEMENTED;
  }
  else {
    local_4 = (**(code **)(in_RDI + 0x10))(in_RDI,in_RSI);
  }
  return local_4;
}

Assistant:

MA_API ma_result ma_vfs_close(ma_vfs* pVFS, ma_vfs_file file)
{
    ma_vfs_callbacks* pCallbacks = (ma_vfs_callbacks*)pVFS;

    if (pVFS == NULL || file == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pCallbacks->onClose == NULL) {
        return MA_NOT_IMPLEMENTED;
    }

    return pCallbacks->onClose(pVFS, file);
}